

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11::detail::clear_instance(PyObject *self)

{
  bool bVar1;
  instance *self_00;
  long *plVar2;
  long in_RDI;
  PyObject *_py_tmp;
  PyObject **dict_ptr;
  value_and_holder *v_h;
  iterator __end2;
  iterator __begin2;
  values_and_holders *__range2;
  instance *instance;
  instance *in_stack_ffffffffffffff58;
  type_info *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  iterator local_88;
  iterator local_58;
  PyObject *in_stack_ffffffffffffffe0;
  
  values_and_holders::values_and_holders
            ((values_and_holders *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  values_and_holders::begin((values_and_holders *)in_stack_ffffffffffffff60);
  values_and_holders::end((values_and_holders *)in_stack_ffffffffffffff60);
  do {
    bVar1 = values_and_holders::iterator::operator!=(&local_58,&local_88);
    if (!bVar1) {
      detail::instance::deallocate_layout((instance *)in_stack_ffffffffffffff60);
      if (*(long *)(in_RDI + 0x28) != 0) {
        PyObject_ClearWeakRefs(in_RDI);
      }
      plVar2 = (long *)_PyObject_GetDictPtr(in_RDI);
      if ((plVar2 != (long *)0x0) && (*plVar2 != 0)) {
        *plVar2 = 0;
        _Py_DECREF((PyObject *)0x132745);
      }
      if ((*(byte *)(in_RDI + 0x30) >> 4 & 1) != 0) {
        clear_patients(in_stack_ffffffffffffffe0);
      }
      return;
    }
    self_00 = (instance *)values_and_holders::iterator::operator*(&local_58);
    bVar1 = value_and_holder::operator_cast_to_bool((value_and_holder *)0x132639);
    if (bVar1) {
      bVar1 = value_and_holder::instance_registered((value_and_holder *)self_00);
      if (bVar1) {
        value_and_holder::value_ptr<void>((value_and_holder *)self_00);
        bVar1 = deregister_instance(self_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        if (!bVar1) {
          pybind11_fail((char *)self_00);
        }
      }
      if (((*(byte *)(in_RDI + 0x30) & 1) != 0) ||
         (bVar1 = value_and_holder::holder_constructed((value_and_holder *)self_00), bVar1)) {
        (**(code **)((long)(self_00->field_1).simple_value_holder[0] + 0x38))(self_00);
      }
    }
    values_and_holders::iterator::operator++((iterator *)self_00);
  } while( true );
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}